

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

bool __thiscall ON_NurbsCage::IsClosed(ON_NurbsCage *this,int dir)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double *pdVar9;
  double *pointA;
  ulong uVar10;
  int d [3];
  ulong local_60;
  int local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  if (((uint)dir < 3) && (0 < this->m_dim)) {
    uVar10 = (ulong)(uint)dir;
    bVar2 = ON_IsKnotVectorClamped
                      (this->m_order[uVar10],this->m_cv_count[uVar10],this->m_knot[uVar10],2);
    if (!bVar2) {
      bVar2 = IsPeriodic(this,dir);
      return bVar2;
    }
    local_58 = 0;
    local_60 = 0;
    *(int *)((long)&local_60 + uVar10 * 4) = this->m_cv_count[uVar10] + -1;
    iVar1 = local_58;
    local_50 = local_60 & 0xffffffff;
    bVar2 = this->m_cv_count[0] <= (int)local_60;
    if ((int)local_60 < this->m_cv_count[0]) {
      uVar10 = local_60 >> 0x20;
      iVar8 = 0;
      local_48 = uVar10;
      do {
        if ((int)uVar10 < this->m_cv_count[1]) {
          iVar7 = 0;
          local_38 = (long)((int)local_50 + iVar8);
          local_40 = (long)iVar8;
          do {
            if (iVar1 < this->m_cv_count[2]) {
              iVar5 = (int)local_48;
              iVar6 = 0;
              do {
                pdVar9 = this->m_cv;
                if (pdVar9 == (double *)0x0) {
                  pointA = (double *)0x0;
                  pdVar9 = (double *)0x0;
                }
                else {
                  pointA = pdVar9 + this->m_cv_stride[0] * local_40 +
                                    (long)this->m_cv_stride[1] * (long)iVar7 +
                                    (long)iVar6 * (long)this->m_cv_stride[2];
                  pdVar9 = pdVar9 + this->m_cv_stride[0] * local_38 +
                                    (long)this->m_cv_stride[1] * (long)(iVar5 + iVar7) +
                                    (long)(iVar1 + iVar6) * (long)this->m_cv_stride[2];
                }
                bVar3 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat,pointA,pdVar9);
                if (!bVar3) {
                  return bVar2;
                }
                iVar4 = iVar1 + iVar6;
                iVar6 = iVar6 + 1;
              } while (iVar4 + 1 < this->m_cv_count[2]);
            }
            iVar5 = (int)local_48 + iVar7;
            iVar7 = iVar7 + 1;
            uVar10 = local_48;
          } while (iVar5 + 1 < this->m_cv_count[1]);
        }
        iVar7 = (int)local_50 + iVar8 + 1;
        iVar8 = iVar8 + 1;
        bVar2 = this->m_cv_count[0] <= iVar7;
      } while (iVar7 < this->m_cv_count[0]);
    }
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_NurbsCage::IsClosed(int dir) const
{
  bool bIsClosed = false;
  if ( dir >= 0 && dir <= 2 && m_dim > 0)
  {
    if ( ON_IsKnotVectorClamped( m_order[dir], m_cv_count[dir], m_knot[dir] ) ) 
    {
      const double *cv0, *cv1;
      int i,j,k,d[3] = {0,0,0};
      d[dir] = m_cv_count[dir] - 1;
      for ( i = 0; i+d[0] < m_cv_count[0]; i++ )
      {
        for ( j = 0; j+d[1] < m_cv_count[1]; j++ )
        {
          for ( k = 0; k+d[2] < m_cv_count[2]; k++ )
          {
            cv0 = CV(i,j,k);
            cv1 = CV(i+d[0],j+d[1],k+d[2]);
            if ( false == ON_PointsAreCoincident( m_dim, m_is_rat, cv0, cv1 ) )
              return false;
          }
        }
      }
      bIsClosed = true;
    }
    else
    {
      bIsClosed =  IsPeriodic(dir);
    }
  }
  return bIsClosed;
}